

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

int64_t TPZSkylMatrix<double>::NumElements(TPZVec<long> *skyline)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < skyline->fNElements) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar3 = lVar4;
      plVar1 = skyline->fStore + lVar2;
      lVar4 = lVar3 + lVar2;
      lVar2 = lVar2 + 1;
      lVar4 = (lVar4 + 1) - *plVar1;
    } while (skyline->fNElements != lVar2);
    return (lVar3 - *plVar1) + lVar2;
  }
  return 0;
}

Assistant:

inline int64_t NElements() const { return fNElements; }